

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-grammar.cpp
# Opt level: O1

char * parse_name(char *src)

{
  char cVar1;
  long lVar2;
  runtime_error *this;
  long *plVar3;
  long *plVar4;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  lVar2 = 0;
  while( true ) {
    cVar1 = src[lVar2];
    if ((((0x19 < (byte)(cVar1 + 0x9fU)) && (9 < (byte)(cVar1 - 0x30U))) && (cVar1 != '-')) &&
       (0x19 < (byte)(cVar1 + 0xbfU))) break;
    lVar2 = lVar2 + 1;
  }
  if (lVar2 != 0) {
    return src + lVar2;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"expecting name at ","");
  plVar3 = (long *)std::__cxx11::string::append((char *)local_48);
  local_68 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_68 == plVar4) {
    local_58 = *plVar4;
    lStack_50 = plVar3[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar4;
  }
  local_60 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::runtime_error::runtime_error(this,(string *)&local_68);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static const char * parse_name(const char * src) {
    const char * pos = src;
    while (is_word_char(*pos)) {
        pos++;
    }
    if (pos == src) {
        throw std::runtime_error(std::string("expecting name at ") + src);
    }
    return pos;
}